

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_utils.cpp
# Opt level: O1

void __thiscall icu_63::number::impl::DecNum::DecNum(DecNum *this,DecNum *other,UErrorCode *status)

{
  uint uVar1;
  decNumber *pdVar2;
  int32_t iVar3;
  int32_t iVar4;
  rounding rVar5;
  rounding rVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  uint8_t uVar9;
  undefined3 uVar10;
  undefined2 uVar11;
  decNumber *pdVar12;
  
  (this->fData).ptr = &(this->fData).stackHeader;
  (this->fData).capacity = 0x22;
  (this->fData).needToRelease = '\0';
  iVar3 = (other->fContext).emax;
  iVar4 = (other->fContext).emin;
  rVar5 = (other->fContext).round;
  rVar6 = (other->fContext).round;
  uVar7 = (other->fContext).traps;
  uVar8 = (other->fContext).status;
  uVar9 = (other->fContext).clamp;
  uVar10 = *(undefined3 *)&(other->fContext).field_0x19;
  (this->fContext).digits = (other->fContext).digits;
  (this->fContext).emax = iVar3;
  (this->fContext).emin = iVar4;
  (this->fContext).round = rVar5;
  (this->fContext).round = rVar6;
  (this->fContext).traps = uVar7;
  (this->fContext).status = uVar8;
  (this->fContext).clamp = uVar9;
  *(undefined3 *)&(this->fContext).field_0x19 = uVar10;
  uVar1 = (this->fContext).digits;
  if (0x22 < (int)uVar1) {
    pdVar12 = (decNumber *)uprv_malloc_63((ulong)uVar1 + 0xc);
    if (pdVar12 == (decNumber *)0x0) {
      *status = U_MEMORY_ALLOCATION_ERROR;
      return;
    }
    pdVar2 = (this->fData).ptr;
    uVar9 = pdVar2->lsu[0];
    uVar11 = *(undefined2 *)&pdVar2->field_0xa;
    pdVar12->bits = pdVar2->bits;
    pdVar12->lsu[0] = uVar9;
    *(undefined2 *)&pdVar12->field_0xa = uVar11;
    iVar3 = pdVar2->exponent;
    pdVar12->digits = pdVar2->digits;
    pdVar12->exponent = iVar3;
    if ((this->fData).needToRelease != '\0') {
      uprv_free_63(pdVar2);
    }
    (this->fData).ptr = pdVar12;
    (this->fData).capacity = uVar1;
    (this->fData).needToRelease = '\x01';
  }
  pdVar12 = (this->fData).ptr;
  pdVar2 = (other->fData).ptr;
  uVar9 = pdVar2->lsu[0];
  uVar11 = *(undefined2 *)&pdVar2->field_0xa;
  pdVar12->bits = pdVar2->bits;
  pdVar12->lsu[0] = uVar9;
  *(undefined2 *)&pdVar12->field_0xa = uVar11;
  iVar3 = pdVar2->exponent;
  pdVar12->digits = pdVar2->digits;
  pdVar12->exponent = iVar3;
  memcpy((this->fData).ptr + 1,(other->fData).ptr + 1,(long)(other->fData).capacity);
  return;
}

Assistant:

DecNum::DecNum(const DecNum& other, UErrorCode& status)
        : fContext(other.fContext) {
    // Allocate memory for the new DecNum.
    U_ASSERT(fContext.digits == other.fData.getCapacity());
    if (fContext.digits > kDefaultDigits) {
        void* p = fData.resize(fContext.digits, 0);
        if (p == nullptr) {
            status = U_MEMORY_ALLOCATION_ERROR;
            return;
        }
    }

    // Copy the data from the old DecNum to the new one.
    uprv_memcpy(fData.getAlias(), other.fData.getAlias(), sizeof(decNumber));
    uprv_memcpy(fData.getArrayStart(),
            other.fData.getArrayStart(),
            other.fData.getArrayLimit() - other.fData.getArrayStart());
}